

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O3

void __thiscall
NodeParser::parseTankReact
          (NodeParser *this,Node *node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  InputError *this_00;
  string local_48;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
    iVar4 = (*(node->super_Element)._vptr_Element[2])(node);
    if (iVar4 == 1) {
      bVar3 = Utilities::parseNumber<double>(pbVar1 + 2,(double *)&node[1].super_Element.index);
      if (!bVar3) {
        this_00 = (InputError *)__cxa_allocate_exception(0x30);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        pcVar2 = pbVar1[2]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_48,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
        InputError::InputError(this_00,6,&local_48);
        __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
  }
  return;
}

Assistant:

void NodeParser::parseTankReact(Node* node, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - TANK keyword
    // 1 - tank ID
    // 2 - reaction coeff. (1/days)

    if ( tokenList.size() < 2 ) return;
    string* tokens = &tokenList[0];

    // ... cast Node to Tank

    if ( node->type() != Node::TANK ) return;
    Tank* tank = static_cast<Tank*>(node);

    // ... read reaction coefficient in 1/days

    if ( !Utilities::parseNumber(tokens[2], tank->bulkCoeff) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }
}